

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

void __thiscall
mp::NLFeeder_Easy::
FeedSuffixes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::SuffixWriterFactory>
          (NLFeeder_Easy *this,SuffixWriterFactory *swf)

{
  _Rb_tree_color nnz;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  double dVar6;
  SuffixIntWriter sw;
  SparseVectorWriter<int,_int> local_70;
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  local_60;
  
  std::
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
              *)&(this->nlme_).suffixes_);
  for (p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    for (p_Var1 = p_Var2[3]._M_parent; p_Var1 != p_Var2[3]._M_left;
        p_Var1 = (_Base_ptr)&p_Var1->_M_parent) {
    }
    nnz = p_Var2[3]._M_color;
    if ((nnz & 4) == _S_red) {
      NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::SuffixWriterFactory::
      StartIntSuffix((SuffixWriterFactory *)&local_70,(char *)swf,(int)*(undefined8 *)(p_Var2 + 1),
                     nnz);
      lVar4 = 0;
      for (uVar5 = 0; uVar5 < (ulong)((long)p_Var2[3]._M_left - (long)p_Var2[3]._M_parent >> 3);
          uVar5 = uVar5 + 1) {
        dVar6 = *(double *)(&(p_Var2[3]._M_parent)->_M_color + uVar5 * 2);
        if ((dVar6 != 0.0) || (NAN(dVar6))) {
          if ((nnz & 3) == _S_red) {
            iVar3 = *(int *)((long)&((this->var_perm_).
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first +
                            (lVar4 >> 0x1d));
          }
          else {
            iVar3 = (int)uVar5;
          }
          dVar6 = round(dVar6);
          NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
          SparseVectorWriter<int,_int>::Write(&local_70,iVar3,(int)dVar6);
        }
        lVar4 = lVar4 + 0x100000000;
      }
    }
    else {
      NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::SuffixWriterFactory::
      StartDblSuffix((SuffixWriterFactory *)&local_70,(char *)swf,(int)*(undefined8 *)(p_Var2 + 1),
                     nnz);
      lVar4 = 0;
      for (uVar5 = 0; uVar5 < (ulong)((long)p_Var2[3]._M_left - (long)p_Var2[3]._M_parent >> 3);
          uVar5 = uVar5 + 1) {
        dVar6 = *(double *)(&(p_Var2[3]._M_parent)->_M_color + uVar5 * 2);
        if ((dVar6 != 0.0) || (NAN(dVar6))) {
          if ((nnz & 3) == _S_red) {
            iVar3 = *(int *)((long)&((this->var_perm_).
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first +
                            (lVar4 >> 0x1d));
          }
          else {
            iVar3 = (int)uVar5;
          }
          NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
          SparseVectorWriter<int,_double>::Write
                    ((SparseVectorWriter<int,_double> *)&local_70,iVar3,dVar6);
        }
        lVar4 = lVar4 + 0x100000000;
      }
    }
  }
  std::
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void FeedSuffixes(SuffixWriterFactory& swf) {
    for (const auto& suf: NLME().Suffixes()) {
      int nnz=0;
      for (auto v: suf.values_)
        if (v)
          ++nnz;
      bool ifVars = (0==(suf.kind_&3));
      if (suf.kind_ & 4) {
        auto sw = swf.StartDblSuffix(
              suf.name_.c_str(), suf.kind_, nnz);
        for (size_t i=0; i<suf.values_.size(); ++i)
          if (suf.values_[i])
            sw.Write(ifVars ? VPerm(i) : i,
                     suf.values_[i]);
      } else {
        auto sw = swf.StartIntSuffix(
              suf.name_.c_str(), suf.kind_, nnz);
        for (size_t i=0; i<suf.values_.size(); ++i)
          if (suf.values_[i])
            sw.Write(ifVars ? VPerm(i) : i,
                     std::round(suf.values_[i]));
      }
    }
  }